

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseExpression(Parser *this,SymbolListCItr endSymbol)

{
  bool bVar1;
  SymbolListCItr SVar2;
  uint32_t local_5c;
  uint32_t count_1;
  SymbolListCItr localEndSymbol;
  uint32_t local_2c;
  uint32_t count;
  Parser *this_local;
  SymbolListCItr endSymbol_local;
  
  bVar1 = Accept(this,SquareOpen);
  if (bVar1) {
    bVar1 = Accept(this,SquareClose);
    if (bVar1) {
      EmitOpcode(this,PushColl);
      EmitCount(this,0);
    }
    else {
      ParseSubexpression(this,endSymbol);
      bVar1 = Accept(this,Comma);
      if (bVar1) {
        ParseExpression(this,endSymbol);
        Expect(this,SquareClose,(char *)0x0);
        local_2c = 1;
        while (bVar1 = Accept(this,Comma), bVar1) {
          Accept(this,NewLine);
          Expect(this,SquareOpen,(char *)0x0);
          ParseSubexpression(this,endSymbol);
          Expect(this,Comma,(char *)0x0);
          ParseSubexpression(this,endSymbol);
          Expect(this,SquareClose,(char *)0x0);
          local_2c = local_2c + 1;
        }
        EmitOpcode(this,PushColl);
        EmitCount(this,local_2c);
      }
      else {
        Error<>(this,"Expected comma separating key-value pair");
      }
    }
  }
  else {
    SVar2 = GetNextSymbolOfType(this,Comma,endSymbol);
    ParseSubexpression(this,SVar2);
    bVar1 = Accept(this,Comma);
    if (bVar1) {
      local_5c = 1;
      do {
        Accept(this,NewLine);
        SVar2 = GetNextSymbolOfType(this,Comma,endSymbol);
        ParseSubexpression(this,SVar2);
        local_5c = local_5c + 1;
        bVar1 = Accept(this,Comma);
      } while (bVar1);
      EmitOpcode(this,PushList);
      EmitCount(this,local_5c);
    }
  }
  return;
}

Assistant:

inline void Parser::ParseExpression(SymbolListCItr endSymbol)
	{
		// Check first for an opening bracket, which indicates either an index operator or a key-value pair.
		if (Accept(SymbolType::SquareOpen))
		{
			if (Accept(SymbolType::SquareClose))
			{
				// If we immediately see a close bracket, create an empty collection
				EmitOpcode(Opcode::PushColl);
				EmitCount(0);
			}
			else
			{
				ParseSubexpression(endSymbol);

				// If we see a comma after a square open bracket, we're parsing a key-value pair
				if (Accept(SymbolType::Comma))
				{
					ParseExpression(endSymbol);
					Expect(SymbolType::SquareClose);

					// Parse all subsequent key-value pairs
					uint32_t count = 1;
					while (Accept(SymbolType::Comma))
					{
						Accept(SymbolType::NewLine);
						Expect(SymbolType::SquareOpen);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::Comma);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::SquareClose);
						++count;
					}

					// Pop all key-value pairs and push a new collection onto the stack
					EmitOpcode(Opcode::PushColl);
					EmitCount(count);
				}
				else
				{
					Error("Expected comma separating key-value pair");
				}
			}
		}
		else
		{
			// Advance only to first comma
			auto localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);

			// Parse the first subexpression, defined as any normal expression excluding index operators or lists, 
			// which are handled in this function
			ParseSubexpression(localEndSymbol);

			// If we finish the first subexpression with a common, then we're parsing an indexed list
			if (Accept(SymbolType::Comma))
			{
				// Parse all subexpressions in comma-delimited list
				uint32_t count = 1;
				do
				{
					Accept(SymbolType::NewLine);
					localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);
					ParseSubexpression(localEndSymbol);
					++count;
				} 
				while (Accept(SymbolType::Comma));

				// Pop all key-value pairs and push the results on the stack
				EmitOpcode(Opcode::PushList);
				EmitCount(count);
			}
		}
	}